

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O3

int Abc_NtkReadLogFile(char *pFileName,Abc_Cex_t **ppCex,int *pnFrames)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar4;
  Abc_Cex_t *pAVar5;
  int nFrames;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  int iFrameCex;
  int iVar9;
  char Buffer [1000];
  int local_430;
  int local_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  char local_410;
  char local_40f [991];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for reading \"%s\".\n",pFileName);
    return -1;
  }
  fgets((char *)&local_418,1000,__stream);
  if (local_410 == 'T' && CONCAT44(uStack_414,local_418) == 0x41534e555f6c6e73) {
    local_42c = atoi(local_40f);
    iVar9 = 1;
LAB_002d7d8a:
    local_430 = -1;
    iVar1 = -1;
  }
  else {
    if (CONCAT31((undefined3)uStack_414,local_418._3_1_) != 0x5441535f || local_418 != 0x5f6c6e73) {
      if (CONCAT31((undefined3)uStack_414,local_418._3_1_) == 0x4b4e555f && local_418 == 0x5f6c6e73)
      {
        local_42c = atoi((char *)((long)&uStack_414 + 3));
      }
      else {
        puts("Unrecognized status.");
        local_42c = -1;
      }
      iVar9 = -1;
      goto LAB_002d7d8a;
    }
    pcVar8 = strtok((char *)((long)&uStack_414 + 3)," \t\n");
    local_42c = atoi(pcVar8);
    iVar9 = 0;
    strtok((char *)0x0," \t\n");
    pcVar8 = strtok((char *)0x0," \t\n");
    iVar1 = -1;
    if (pcVar8 == (char *)0x0) {
      local_430 = -1;
    }
    else {
      local_430 = atoi(pcVar8);
      pcVar8 = strtok((char *)0x0," \t\n");
      iVar9 = 0;
      if (pcVar8 != (char *)0x0) {
        iVar1 = atoi(pcVar8);
        iVar9 = 0;
      }
    }
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  while ((uVar2 = fgetc(__stream), uVar2 != 0xffffffff && (uVar2 != 10))) {
    if ((uVar2 & 0xfffffffe) == 0x30) {
      Vec_IntPush(p,uVar2 - 0x30);
    }
  }
  uVar2 = p->nSize;
  while (uVar3 = fgetc(__stream), uVar3 != 0xffffffff) {
    if ((uVar3 & 0xfffffffe) == 0x30) {
      Vec_IntPush(p,uVar3 - 0x30);
    }
  }
  fclose(__stream);
  uVar3 = p->nSize;
  uVar7 = (ulong)uVar3;
  if (iVar1 == -1) {
    iVar1 = local_42c;
  }
  if (uVar7 == 0) {
    pAVar5 = Abc_CexAlloc(0,0,iVar1 + 1);
    pAVar5->iFrame = iVar1;
    pAVar5->iPo = local_430;
    if (ppCex != (Abc_Cex_t **)0x0) {
      *ppCex = pAVar5;
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
    }
    free(p);
    goto LAB_002d7e79;
  }
  if ((int)uVar2 < 0) {
    pcVar8 = "Cannot read register number.";
LAB_002d7ea2:
    puts(pcVar8);
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
    }
    free(p);
    return -1;
  }
  if (uVar3 == uVar2) {
    pcVar8 = "Cannot read counter example.";
    goto LAB_002d7ea2;
  }
  nFrames = iVar1 + 1;
  if ((int)(uVar3 - uVar2) % nFrames != 0) {
    pcVar8 = "Incorrect number of bits.";
    goto LAB_002d7ea2;
  }
  pAVar5 = Abc_CexAlloc(uVar2,(int)(uVar3 - uVar2) / nFrames,nFrames);
  pAVar5->iPo = local_430;
  pAVar5->iFrame = iVar1;
  if (uVar3 != pAVar5->nBits) {
    __assert_fail("Vec_IntSize(vNums) == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLog.c"
                  ,0xdb,"int Abc_NtkReadLogFile(char *, Abc_Cex_t **, int *)");
  }
  if ((int)uVar3 < 1) {
    piVar4 = p->pArray;
    if (piVar4 != (int *)0x0) goto LAB_002d7f4c;
  }
  else {
    piVar4 = p->pArray;
    uVar6 = 0;
    do {
      if (uVar7 == uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (piVar4[uVar6] != 0) {
        (&pAVar5[1].iPo)[uVar6 >> 5] = (&pAVar5[1].iPo)[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar7);
LAB_002d7f4c:
    free(piVar4);
  }
  free(p);
  if (ppCex == (Abc_Cex_t **)0x0) {
    free(pAVar5);
  }
  else {
    *ppCex = pAVar5;
  }
LAB_002d7e79:
  if (pnFrames != (int *)0x0) {
    *pnFrames = local_42c;
    return iVar9;
  }
  return iVar9;
}

Assistant:

int Abc_NtkReadLogFile( char * pFileName, Abc_Cex_t ** ppCex, int * pnFrames )
{
    FILE * pFile;
    Abc_Cex_t * pCex;
    Vec_Int_t * vNums;
    char Buffer[1000], * pToken, * RetValue;
    int c, nRegs = -1, nFrames = -1, iPo = -1, Status = -1, nFrames2 = -1;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for reading \"%s\".\n" , pFileName );
        return -1;
    }
    RetValue = fgets( Buffer, 1000, pFile );
    if ( !strncmp( Buffer, "snl_UNSAT", strlen("snl_UNSAT") ) )
    {
        Status = 1;
        nFrames = atoi( Buffer + strlen("snl_UNSAT") ); 
    }
    else if ( !strncmp( Buffer, "snl_SAT", strlen("snl_SAT") ) )
    {
        Status = 0;
//        nFrames = atoi( Buffer + strlen("snl_SAT") ); 
        pToken  = strtok( Buffer + strlen("snl_SAT"), " \t\n" );
        nFrames = atoi( pToken ); 
        pToken  = strtok( NULL, " \t\n" );
        pToken  = strtok( NULL, " \t\n" );
        if ( pToken != NULL )
        {
            iPo     = atoi( pToken ); 
            pToken  = strtok( NULL, " \t\n" );
            if ( pToken )
                nFrames2 = atoi( pToken ); 
        }
//        else
//            printf( "Warning! The current status is SAT but the current CEX is not given.\n"  );
    }
    else if ( !strncmp( Buffer, "snl_UNK", strlen("snl_UNK") ) )
    {
        Status = -1;
        nFrames = atoi( Buffer + strlen("snl_UNK") ); 
    }
    else
    {
        printf( "Unrecognized status.\n" );
    }
    // found regs till the new line
    vNums = Vec_IntAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' )
            break;
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    nRegs = Vec_IntSize(vNums);
    // skip till the new line
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    fclose( pFile );
    if ( Vec_IntSize(vNums) )
    {
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        if ( nRegs < 0 )
        {
            printf( "Cannot read register number.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( Vec_IntSize(vNums)-nRegs == 0 )
        {
            printf( "Cannot read counter example.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( (Vec_IntSize(vNums)-nRegs) % (iFrameCex + 1) != 0 )
        {
            printf( "Incorrect number of bits.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        pCex = Abc_CexAlloc( nRegs, (Vec_IntSize(vNums)-nRegs)/(iFrameCex + 1), iFrameCex + 1 );
        pCex->iPo    = iPo;
        pCex->iFrame = iFrameCex;
        assert( Vec_IntSize(vNums) == pCex->nBits );
        for ( c = 0; c < pCex->nBits; c++ )
            if ( Vec_IntEntry(vNums, c) )
                Abc_InfoSetBit( pCex->pData, c );
        Vec_IntFree( vNums );
        if ( ppCex )
            *ppCex = pCex;
        else
            ABC_FREE( pCex );
    }
    else
    {                                                         
        // corner case of seq circuit with no PIs             
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        pCex = Abc_CexAlloc( 0, 0, iFrameCex + 1 );           
        pCex->iFrame = iFrameCex;                             
        pCex->iPo    = iPo;                                   
        if ( ppCex )                                          
            *ppCex = pCex;                                    
        Vec_IntFree( vNums );                                 
    }                                                         
    if ( pnFrames )
        *pnFrames = nFrames;
    return Status;
}